

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O1

URegistryKey __thiscall
icu_63::ICUService::registerFactory
          (ICUService *this,ICUServiceFactory *factoryToAdopt,UErrorCode *status)

{
  bool bVar1;
  UVector *this_00;
  ICUServiceFactory *size;
  
  if ((factoryToAdopt == (ICUServiceFactory *)0x0) || (U_ZERO_ERROR < *status)) goto LAB_002a79b7;
  size = factoryToAdopt;
  umtx_lock_63((UMutex *)lock);
  if (this->factories == (UVector *)0x0) {
    this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
    if (this_00 == (UVector *)0x0) {
      this_00 = (UVector *)0x0;
    }
    else {
      UVector::UVector(this_00,deleteUObject,(UElementsAreEqual *)0x0,status);
    }
    this->factories = this_00;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002a7928;
    if (this_00 != (UVector *)0x0) {
      (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
    }
    bVar1 = false;
  }
  else {
LAB_002a7928:
    UVector::insertElementAt(this->factories,factoryToAdopt,0,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      bVar1 = true;
      (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x12])(this);
    }
    else {
      (*(factoryToAdopt->super_UObject)._vptr_UObject[1])(factoryToAdopt);
      bVar1 = true;
      factoryToAdopt = (ICUServiceFactory *)0x0;
    }
  }
  umtx_unlock_63((UMutex *)lock);
  if (!bVar1) {
    return (URegistryKey)0x0;
  }
LAB_002a79b7:
  if (factoryToAdopt != (ICUServiceFactory *)0x0) {
    (*(this->super_ICUNotifier)._vptr_ICUNotifier[4])(this);
  }
  return factoryToAdopt;
}

Assistant:

URegistryKey
ICUService::registerFactory(ICUServiceFactory* factoryToAdopt, UErrorCode& status) 
{
    if (U_SUCCESS(status) && factoryToAdopt != NULL) {
        Mutex mutex(&lock);

        if (factories == NULL) {
            factories = new UVector(deleteUObject, NULL, status);
            if (U_FAILURE(status)) {
                delete factories;
                return NULL;
            }
        }
        factories->insertElementAt(factoryToAdopt, 0, status);
        if (U_SUCCESS(status)) {
            clearCaches();
        } else {
            delete factoryToAdopt;
            factoryToAdopt = NULL;
        }
    }

    if (factoryToAdopt != NULL) {
        notifyChanged();
    }

    return (URegistryKey)factoryToAdopt;
}